

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
          *this,WebSocketResponse *value)

{
  undefined1 local_1a8 [416];
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1a8[0] = false;
    local_1a8[0x160] = true;
    local_1a8._360_8_ = *(undefined8 *)value;
    local_1a8._368_8_ = (value->statusText).content.ptr;
    local_1a8._376_8_ = (value->statusText).content.size_;
    local_1a8._384_8_ = value->headers;
    local_1a8._392_4_ = (value->webSocketOrBody).tag;
    if (local_1a8._392_4_ - 1 < 2) {
      local_1a8._400_8_ = (value->webSocketOrBody).field_1.forceAligned;
      local_1a8._408_8_ = *(undefined8 *)((long)&(value->webSocketOrBody).field_1 + 8);
      *(undefined8 *)((long)&(value->webSocketOrBody).field_1 + 8) = 0;
    }
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              (&this->result,(ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1a8);
    if (local_1a8[0x160] == true) {
      OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
                ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)
                 (local_1a8 + 0x188));
    }
    if (local_1a8[0] == true) {
      Exception::~Exception((Exception *)(local_1a8 + 8));
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }